

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# simulator.cc
# Opt level: O1

void __thiscall brown::Simulator::~Simulator(Simulator *this)

{
  this->_vptr_Simulator = (_func_int **)&PTR___cxa_pure_virtual_00109d58;
  if (this->fifclk != (int64_t *)0x0) {
    operator_delete__(this->fifclk);
  }
  if (this->fifcurx != (int *)0x0) {
    operator_delete__(this->fifcurx);
  }
  if (this->fifcury != (int *)0x0) {
    operator_delete__(this->fifcury);
  }
  if (this->fifbit != (char *)0x0) {
    operator_delete__(this->fifbit);
  }
  Tile::~Tile(&this->drawing);
  return;
}

Assistant:

Simulator::~Simulator() {
    delete[] fifclk;
    delete[] fifcurx;
    delete[] fifcury;
    delete[] fifbit;
}